

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makelevelset3.cpp
# Opt level: O3

void make_level_set3(vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> *tri,
                    vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *x,Vec3f *origin,
                    float dx,int ni,int nj,int nk,Array3f *phi,int exact_band)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  uint uVar12;
  uint uVar13;
  unsigned_long uVar14;
  pointer pVVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined8 uVar21;
  byte bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  byte bVar26;
  undefined1 auVar27 [16];
  int iVar28;
  int iVar29;
  int iVar30;
  pointer pVVar31;
  float *pfVar32;
  int *piVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  int iVar38;
  ulong uVar39;
  bool bVar40;
  int iVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  bool bVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  float fVar50;
  double dVar51;
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  double dVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  double dVar62;
  double dVar63;
  double dVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  double dVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined4 in_XMM8_Da;
  undefined4 in_XMM8_Db;
  undefined8 in_XMM8_Qb;
  ulong local_1c0;
  Vec3f local_160;
  double local_150;
  ulong local_148;
  Array3<int,_Array1<int>_> local_140;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  Array3<int,_Array1<int>_> local_f0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  Array3<float,_Array1<float>_>::resize(phi,ni,nj,nk);
  uVar14 = (phi->a).n;
  if (uVar14 != 0) {
    fVar50 = (float)(nj + ni + nk) * dx;
    pfVar32 = (phi->a).data;
    auVar47 = vpbroadcastq_avx512vl();
    uVar39 = 0;
    auVar19 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar20 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    do {
      auVar48 = vpbroadcastq_avx512vl();
      auVar49 = vpor_avx2(auVar48,auVar19);
      auVar48 = vpor_avx2(auVar48,auVar20);
      uVar21 = vpcmpuq_avx512vl(auVar48,auVar47,2);
      bVar26 = (byte)uVar21;
      uVar21 = vpcmpuq_avx512vl(auVar49,auVar47,2);
      bVar22 = (byte)uVar21 << 4;
      pauVar1 = (undefined1 (*) [32])(pfVar32 + uVar39);
      auVar49._0_4_ =
           (uint)(bVar26 & 1) * (int)fVar50 | (uint)!(bool)(bVar26 & 1) * *(int *)*pauVar1;
      bVar45 = (bool)((bVar26 & 2) >> 1);
      auVar49._4_4_ = (uint)bVar45 * (int)fVar50 | (uint)!bVar45 * *(int *)(*pauVar1 + 4);
      bVar45 = (bool)((bVar26 & 4) >> 2);
      auVar49._8_4_ = (uint)bVar45 * (int)fVar50 | (uint)!bVar45 * *(int *)(*pauVar1 + 8);
      bVar45 = (bool)((bVar26 & 0xf) >> 3);
      auVar49._12_4_ = (uint)bVar45 * (int)fVar50 | (uint)!bVar45 * *(int *)(*pauVar1 + 0xc);
      bVar45 = (bool)((byte)uVar21 & 1);
      auVar49._16_4_ = (uint)bVar45 * (int)fVar50 | (uint)!bVar45 * *(int *)(*pauVar1 + 0x10);
      bVar45 = (bool)(bVar22 >> 5 & 1);
      auVar49._20_4_ = (uint)bVar45 * (int)fVar50 | (uint)!bVar45 * *(int *)(*pauVar1 + 0x14);
      bVar45 = (bool)(bVar22 >> 6 & 1);
      auVar49._24_4_ = (uint)bVar45 * (int)fVar50 | (uint)!bVar45 * *(int *)(*pauVar1 + 0x18);
      auVar49._28_4_ =
           (uint)(bVar22 >> 7) * (int)fVar50 |
           (uint)!(bool)(bVar22 >> 7) * *(int *)(*pauVar1 + 0x1c);
      *pauVar1 = auVar49;
      uVar39 = uVar39 + 8;
    } while ((uVar14 + 7 & 0xfffffffffffffff8) != uVar39);
  }
  local_140.ni = -1;
  Array3<int,_Array1<int>_>::Array3(&local_f0,ni,nj,nk,&local_140.ni);
  local_160.v._0_8_ = (ulong)(uint)local_160.v[1] << 0x20;
  Array3<int,_Array1<int>_>::Array3(&local_140,ni,nj,nk,(int *)&local_160);
  pVVar31 = (tri->super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((tri->super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != pVVar31) {
    local_c8 = (double)dx;
    uVar34 = ni - 1;
    iVar35 = nj + -1;
    iVar36 = nk + -1;
    local_1c0 = 0;
    dStack_c0 = local_c8;
    local_b8 = local_c8;
    local_48 = dx;
    fStack_44 = dx;
    fStack_40 = dx;
    fStack_3c = dx;
    do {
      uVar11 = pVVar31[local_1c0].v[0];
      uVar12 = pVVar31[local_1c0].v[1];
      uVar13 = pVVar31[local_1c0].v[2];
      pVVar15 = (x->super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>)._M_impl.
                super__Vector_impl_data._M_start;
      auVar58._0_8_ = (double)origin->v[0];
      auVar73._0_8_ = ((double)pVVar15[uVar11].v[0] - auVar58._0_8_) / local_b8;
      auVar73._8_8_ = 0;
      auVar46 = vinsertps_avx(ZEXT416((uint)pVVar15[uVar12].v[2]),
                              ZEXT416((uint)pVVar15[uVar11].v[2]),0x10);
      auVar46 = vcvtps2pd_avx(auVar46);
      auVar16 = vinsertps_avx(ZEXT416((uint)pVVar15[uVar13].v[0]),
                              ZEXT416((uint)pVVar15[uVar12].v[0]),0x10);
      auVar16 = vcvtps2pd_avx(auVar16);
      auVar58._8_8_ = auVar58._0_8_;
      auVar16 = vsubpd_avx(auVar16,auVar58);
      auVar17._8_8_ = dStack_c0;
      auVar17._0_8_ = local_c8;
      local_108 = vdivpd_avx(auVar16,auVar17);
      local_118 = vshufpd_avx(local_108,local_108,1);
      auVar16 = vminsd_avx(local_108,local_118);
      auVar16 = vminsd_avx(auVar16,auVar73);
      uVar37 = (int)auVar16._0_8_ - exact_band;
      uVar43 = uVar34;
      if ((int)uVar37 < (int)uVar34) {
        uVar43 = uVar37;
      }
      if ((int)uVar37 < 0) {
        uVar43 = 0;
      }
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *(ulong *)(origin->v + 1);
      auVar16 = vcvtps2pd_avx(auVar16);
      local_78._0_8_ = ((double)pVVar15[uVar11].v[1] - auVar16._0_8_) / local_b8;
      local_78._8_8_ = 0;
      local_58._0_8_ = ((double)pVVar15[uVar12].v[1] - auVar16._0_8_) / local_b8;
      local_58._8_8_ = 0;
      auVar58 = vshufpd_avx(auVar16,auVar16,3);
      auVar46 = vsubpd_avx(auVar46,auVar58);
      local_88 = vdivpd_avx(auVar46,auVar17);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = *(ulong *)(pVVar15[uVar13].v + 1);
      auVar46 = vcvtps2pd_avx(auVar46);
      auVar46 = vsubpd_avx(auVar46,auVar16);
      local_68 = vdivpd_avx(auVar46,auVar17);
      auVar46 = vunpcklpd_avx(local_58,local_88);
      auVar46 = vminpd_avx(local_68,auVar46);
      auVar16 = vshufpd_avx(local_88,local_88,1);
      auVar65._8_8_ = local_88._8_8_;
      auVar65._0_8_ = local_78._0_8_;
      local_a8 = vminpd_avx(auVar46,auVar65);
      iVar28 = (int)local_a8._0_8_ - exact_band;
      iVar44 = iVar35;
      if (iVar28 < iVar35) {
        iVar44 = iVar28;
      }
      if (iVar28 < 0) {
        iVar44 = 0;
      }
      auVar46 = vmaxsd_avx(local_68,local_58);
      auVar17 = vshufpd_avx(local_a8,local_a8,1);
      auVar46 = vmaxsd_avx(auVar46,local_78);
      iVar29 = (int)auVar17._0_8_ - exact_band;
      iVar28 = iVar36;
      if (iVar29 < iVar36) {
        iVar28 = iVar29;
      }
      if (iVar29 < 0) {
        iVar28 = 0;
      }
      local_98 = vshufpd_avx(local_68,local_68,1);
      auVar17 = vmaxsd_avx(local_98,local_88);
      auVar16 = vmaxsd_avx(auVar17,auVar16);
      local_150 = auVar16._0_8_;
      iVar29 = (int)local_150 + exact_band + 1;
      if (iVar36 <= iVar29) {
        iVar29 = iVar36;
      }
      if ((int)local_150 + exact_band < -1) {
        iVar29 = 0;
      }
      if (iVar28 <= iVar29) {
        iVar30 = (int)auVar46._0_8_;
        iVar41 = iVar30 + exact_band + 1;
        if (iVar35 <= iVar41) {
          iVar41 = iVar35;
        }
        if (iVar30 + exact_band < -1) {
          iVar41 = 0;
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_118._0_8_;
        auVar16 = vmaxsd_avx(local_108,auVar2);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = auVar73._0_8_;
        auVar16 = vmaxsd_avx(auVar16,auVar3);
        uVar37 = (int)auVar16._0_8_ + exact_band + 1;
        if ((int)uVar34 <= (int)uVar37) {
          uVar37 = uVar34;
        }
        local_148 = (ulong)uVar37;
        if ((int)auVar16._0_8_ + exact_band < -1) {
          local_148 = 0;
        }
        iVar30 = (int)local_148;
        do {
          if (iVar44 <= iVar41) {
            iVar42 = iVar44;
            do {
              if ((int)uVar43 <= (int)local_148) {
                uVar37 = uVar43;
                do {
                  auVar53._0_4_ = (float)(int)uVar37;
                  auVar53._8_8_ = in_XMM8_Qb;
                  auVar53._4_4_ = in_XMM8_Db;
                  auVar16 = vinsertps_avx(auVar53,ZEXT416((uint)(float)iVar42),0x10);
                  auVar17 = vfmadd231ss_fma(ZEXT416((uint)origin->v[2]),ZEXT416((uint)(float)iVar28)
                                            ,ZEXT416((uint)dx));
                  auVar66._8_8_ = 0;
                  auVar66._0_8_ = *(ulong *)origin->v;
                  auVar27._4_4_ = fStack_44;
                  auVar27._0_4_ = local_48;
                  auVar27._8_4_ = fStack_40;
                  auVar27._12_4_ = fStack_3c;
                  auVar16 = vfmadd231ps_fma(auVar66,auVar16,auVar27);
                  local_160.v._0_8_ = vmovlps_avx(auVar16);
                  local_160.v[2] = auVar17._0_4_;
                  pVVar15 = (x->super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  fVar50 = point_triangle_distance
                                     (&local_160,pVVar15 + uVar11,pVVar15 + uVar12,pVVar15 + uVar13)
                  ;
                  pfVar32 = Array3<float,_Array1<float>_>::operator()(phi,uVar37,iVar42,iVar28);
                  if (fVar50 < *pfVar32) {
                    pfVar32 = Array3<float,_Array1<float>_>::operator()(phi,uVar37,iVar42,iVar28);
                    *pfVar32 = fVar50;
                    piVar33 = Array3<int,_Array1<int>_>::operator()(&local_f0,uVar37,iVar42,iVar28);
                    *piVar33 = (int)local_1c0;
                  }
                  uVar37 = uVar37 + 1;
                } while (iVar30 + 1U != uVar37);
              }
              bVar45 = iVar42 != iVar41;
              iVar42 = iVar42 + 1;
            } while (bVar45);
          }
          bVar45 = iVar28 != iVar29;
          iVar28 = iVar28 + 1;
        } while (bVar45);
      }
      auVar16 = vroundpd_avx(local_a8,10);
      auVar54._0_4_ = (int)auVar16._0_8_;
      auVar54._4_4_ = (int)auVar16._8_8_;
      auVar54._8_8_ = 0;
      iVar44 = auVar54._0_4_;
      if (iVar35 <= auVar54._0_4_) {
        iVar44 = iVar35;
      }
      uVar39 = vpmovd2m_avx512vl(auVar54);
      if ((uVar39 & 1) != 0) {
        iVar44 = 0;
      }
      iVar28 = auVar54._4_4_;
      if (iVar36 <= auVar54._4_4_) {
        iVar28 = iVar36;
      }
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_150;
      auVar24._4_4_ = in_XMM8_Db;
      auVar24._0_4_ = in_XMM8_Da;
      auVar24._8_8_ = in_XMM8_Qb;
      auVar16 = vroundsd_avx(auVar24,auVar4,9);
      iVar29 = (int)auVar16._0_8_;
      if ((uVar39 & 2) != 0) {
        iVar28 = 0;
      }
      iVar41 = iVar36;
      if (iVar29 < iVar36) {
        iVar41 = iVar29;
      }
      if (iVar29 < 0) {
        iVar41 = 0;
      }
      if (iVar28 <= iVar41) {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = auVar46._0_8_;
        auVar25._4_4_ = in_XMM8_Db;
        auVar25._0_4_ = in_XMM8_Da;
        auVar25._8_8_ = in_XMM8_Qb;
        auVar46 = vroundsd_avx(auVar25,auVar5,9);
        iVar30 = (int)auVar46._0_8_;
        iVar29 = iVar35;
        if (iVar30 < iVar35) {
          iVar29 = iVar30;
        }
        if (iVar30 < 0) {
          iVar29 = 0;
        }
        do {
          if (iVar44 <= iVar29) {
            dVar51 = (double)iVar28;
            auVar59._8_8_ = dVar51;
            auVar59._0_8_ = dVar51;
            auVar46 = vsubpd_avx(local_88,auVar59);
            dVar51 = (double)local_98._0_8_ - dVar51;
            dVar62 = auVar46._0_8_;
            auVar46 = vshufpd_avx(auVar46,auVar46,1);
            dVar57 = auVar46._0_8_;
            iVar30 = iVar44;
            do {
              dVar63 = (double)iVar30;
              dVar18 = (double)local_58._0_8_ - dVar63;
              dVar70 = (double)local_68._0_8_ - dVar63;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = dVar62;
              auVar55._8_8_ = 0;
              auVar55._0_8_ = dVar18 * dVar51;
              auVar71._8_8_ = 0;
              auVar71._0_8_ = dVar70;
              auVar46 = vfmsub231sd_fma(auVar55,auVar71,auVar6);
              dVar52 = auVar46._0_8_;
              iVar42 = 1;
              if (dVar52 <= 0.0) {
                if (dVar52 < 0.0) {
                  iVar42 = -1;
                  goto LAB_001054d9;
                }
                iVar42 = (uint)(dVar62 < dVar51) * 2 + -1;
                if (((dVar51 != dVar62) || (iVar42 = 1, dVar70 < dVar18)) ||
                   (iVar42 = -1, dVar18 < dVar70)) goto LAB_001054d9;
              }
              else {
LAB_001054d9:
                dVar63 = (double)local_78._0_8_ - dVar63;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = dVar51;
                auVar67._8_8_ = 0;
                auVar67._0_8_ = dVar70 * dVar57;
                auVar69._8_8_ = 0;
                auVar69._0_8_ = dVar63;
                auVar16 = vfmsub231sd_fma(auVar67,auVar69,auVar7);
                dVar64 = auVar16._0_8_;
                iVar38 = 1;
                if (dVar64 <= 0.0) {
                  if (dVar64 < 0.0) {
                    iVar38 = -1;
                  }
                  else {
                    iVar38 = (uint)(dVar51 < dVar57) * 2 + -1;
                    if ((dVar57 == dVar51) && (iVar38 = 1, dVar70 <= dVar63)) {
                      iVar38 = -(uint)(dVar70 < dVar63);
                    }
                  }
                }
                if (iVar38 == iVar42) {
                  auVar8._8_8_ = 0;
                  auVar8._0_8_ = dVar57;
                  auVar60._8_8_ = 0;
                  auVar60._0_8_ = dVar18;
                  auVar72._8_8_ = 0;
                  auVar72._0_8_ = dVar63 * dVar62;
                  auVar16 = vfmsub231sd_fma(auVar72,auVar60,auVar8);
                  dVar70 = auVar16._0_8_;
                  iVar38 = 1;
                  if (dVar70 <= 0.0) {
                    if (dVar70 < 0.0) {
                      iVar38 = -1;
                    }
                    else {
                      iVar38 = (uint)(dVar57 < dVar62) * 2 + -1;
                      if ((dVar62 == dVar57) && (iVar38 = 1, dVar63 <= dVar18)) {
                        iVar38 = -(uint)(dVar63 < dVar18);
                      }
                    }
                  }
                  if (iVar38 == iVar42) {
                    dVar18 = dVar70 + dVar52 + dVar64;
                    if ((dVar18 == 0.0) && (!NAN(dVar18))) {
                      __assert_fail("sum!=0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/alecjacobson[P]SDFGen/makelevelset3.cpp"
                                    ,0x6f,
                                    "bool point_in_triangle_2d(double, double, double, double, double, double, double, double, double &, double &, double &)"
                                   );
                    }
                    auVar56._0_8_ = dVar52 / dVar18;
                    auVar56._8_8_ = auVar46._8_8_;
                    auVar61._0_8_ = dVar70 / dVar18;
                    auVar61._8_8_ = auVar16._8_8_;
                    auVar9._8_8_ = 0;
                    auVar9._0_8_ = auVar73._0_8_;
                    auVar68._8_8_ = 0;
                    auVar68._0_8_ = (dVar64 / dVar18) * (double)local_118._0_8_;
                    auVar46 = vfmadd231sd_fma(auVar68,auVar56,auVar9);
                    auVar10._8_8_ = 0;
                    auVar10._0_8_ = local_108._0_8_;
                    auVar46 = vfmadd231sd_fma(auVar46,auVar61,auVar10);
                    auVar46 = vroundsd_avx(auVar46,auVar46,10);
                    iVar42 = (int)auVar46._0_8_;
                    if (iVar42 < 0) {
                      iVar42 = 0;
                    }
                    else if (ni <= iVar42) goto LAB_00105690;
                    piVar33 = Array3<int,_Array1<int>_>::operator()(&local_140,iVar42,iVar30,iVar28)
                    ;
                    *piVar33 = *piVar33 + 1;
                  }
                }
              }
LAB_00105690:
              iVar30 = iVar30 + 1;
            } while (iVar29 + 1 != iVar30);
          }
          bVar45 = iVar28 != iVar41;
          iVar28 = iVar28 + 1;
        } while (bVar45);
      }
      local_1c0 = (ulong)((int)local_1c0 + 1);
      pVVar31 = (tri->
                super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar39 = ((long)(tri->
                      super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar31 >> 2) *
               -0x5555555555555555;
    } while (local_1c0 <= uVar39 && uVar39 - local_1c0 != 0);
  }
  bVar45 = true;
  do {
    bVar40 = bVar45;
    sweep(tri,x,phi,&local_f0,origin,dx,1,1,1);
    sweep(tri,x,phi,&local_f0,origin,dx,-1,-1,-1);
    sweep(tri,x,phi,&local_f0,origin,dx,1,1,-1);
    sweep(tri,x,phi,&local_f0,origin,dx,-1,-1,1);
    sweep(tri,x,phi,&local_f0,origin,dx,1,-1,1);
    sweep(tri,x,phi,&local_f0,origin,dx,-1,1,-1);
    sweep(tri,x,phi,&local_f0,origin,dx,1,-1,-1);
    sweep(tri,x,phi,&local_f0,origin,dx,-1,1,1);
    bVar45 = false;
  } while (bVar40);
  if (0 < nk) {
    iVar35 = 0;
    do {
      if (0 < nj) {
        iVar36 = 0;
        do {
          if (0 < ni) {
            iVar44 = 0;
            uVar34 = 0;
            do {
              piVar33 = Array3<int,_Array1<int>_>::operator()(&local_140,iVar44,iVar36,iVar35);
              uVar34 = uVar34 + *piVar33;
              if ((uVar34 & 0x80000001) == 1) {
                pfVar32 = Array3<float,_Array1<float>_>::operator()(phi,iVar44,iVar36,iVar35);
                fVar50 = *pfVar32;
                pfVar32 = Array3<float,_Array1<float>_>::operator()(phi,iVar44,iVar36,iVar35);
                auVar23._8_4_ = 0x80000000;
                auVar23._0_8_ = 0x8000000080000000;
                auVar23._12_4_ = 0x80000000;
                auVar46 = vxorps_avx512vl(ZEXT416((uint)fVar50),auVar23);
                *pfVar32 = auVar46._0_4_;
              }
              iVar44 = iVar44 + 1;
            } while (ni != iVar44);
          }
          iVar36 = iVar36 + 1;
        } while (iVar36 != nj);
      }
      iVar35 = iVar35 + 1;
    } while (iVar35 != nk);
  }
  local_140.ni = 0;
  local_140.nj = 0;
  free(local_140.a.data);
  local_f0.ni = 0;
  local_f0.nj = 0;
  free(local_f0.a.data);
  return;
}

Assistant:

void make_level_set3(const std::vector<Vec3ui> &tri, const std::vector<Vec3f> &x,
                     const Vec3f &origin, float dx, int ni, int nj, int nk,
                     Array3f &phi, const int exact_band)
{
   phi.resize(ni, nj, nk);
   phi.assign((ni+nj+nk)*dx); // upper bound on distance
   Array3i closest_tri(ni, nj, nk, -1);
   Array3i intersection_count(ni, nj, nk, 0); // intersection_count(i,j,k) is # of tri intersections in (i-1,i]x{j}x{k}
   // we begin by initializing distances near the mesh, and figuring out intersection counts
   Vec3f ijkmin, ijkmax;
   for(unsigned int t=0; t<tri.size(); ++t){
     unsigned int p, q, r; assign(tri[t], p, q, r);
     // coordinates in grid to high precision
      double fip=((double)x[p][0]-origin[0])/dx, fjp=((double)x[p][1]-origin[1])/dx, fkp=((double)x[p][2]-origin[2])/dx;
      double fiq=((double)x[q][0]-origin[0])/dx, fjq=((double)x[q][1]-origin[1])/dx, fkq=((double)x[q][2]-origin[2])/dx;
      double fir=((double)x[r][0]-origin[0])/dx, fjr=((double)x[r][1]-origin[1])/dx, fkr=((double)x[r][2]-origin[2])/dx;
      // do distances nearby
      int i0=clamp(int(min(fip,fiq,fir))-exact_band, 0, ni-1), i1=clamp(int(max(fip,fiq,fir))+exact_band+1, 0, ni-1);
      int j0=clamp(int(min(fjp,fjq,fjr))-exact_band, 0, nj-1), j1=clamp(int(max(fjp,fjq,fjr))+exact_band+1, 0, nj-1);
      int k0=clamp(int(min(fkp,fkq,fkr))-exact_band, 0, nk-1), k1=clamp(int(max(fkp,fkq,fkr))+exact_band+1, 0, nk-1);
      for(int k=k0; k<=k1; ++k) for(int j=j0; j<=j1; ++j) for(int i=i0; i<=i1; ++i){
         Vec3f gx(i*dx+origin[0], j*dx+origin[1], k*dx+origin[2]);
         float d=point_triangle_distance(gx, x[p], x[q], x[r]);
         if(d<phi(i,j,k)){
            phi(i,j,k)=d;
            closest_tri(i,j,k)=t;
         }
      }
      // and do intersection counts
      j0=clamp((int)std::ceil(min(fjp,fjq,fjr)), 0, nj-1);
      j1=clamp((int)std::floor(max(fjp,fjq,fjr)), 0, nj-1);
      k0=clamp((int)std::ceil(min(fkp,fkq,fkr)), 0, nk-1);
      k1=clamp((int)std::floor(max(fkp,fkq,fkr)), 0, nk-1);
      for(int k=k0; k<=k1; ++k) for(int j=j0; j<=j1; ++j){
         double a, b, c;
         if(point_in_triangle_2d(j, k, fjp, fkp, fjq, fkq, fjr, fkr, a, b, c)){
            double fi=a*fip+b*fiq+c*fir; // intersection i coordinate
            int i_interval=int(std::ceil(fi)); // intersection is in (i_interval-1,i_interval]
            if(i_interval<0) ++intersection_count(0, j, k); // we enlarge the first interval to include everything to the -x direction
            else if(i_interval<ni) ++intersection_count(i_interval,j,k);
            // we ignore intersections that are beyond the +x side of the grid
         }
      }
   }
   // and now we fill in the rest of the distances with fast sweeping
   for(unsigned int pass=0; pass<2; ++pass){
      sweep(tri, x, phi, closest_tri, origin, dx, +1, +1, +1);
      sweep(tri, x, phi, closest_tri, origin, dx, -1, -1, -1);
      sweep(tri, x, phi, closest_tri, origin, dx, +1, +1, -1);
      sweep(tri, x, phi, closest_tri, origin, dx, -1, -1, +1);
      sweep(tri, x, phi, closest_tri, origin, dx, +1, -1, +1);
      sweep(tri, x, phi, closest_tri, origin, dx, -1, +1, -1);
      sweep(tri, x, phi, closest_tri, origin, dx, +1, -1, -1);
      sweep(tri, x, phi, closest_tri, origin, dx, -1, +1, +1);
   }
   // then figure out signs (inside/outside) from intersection counts
   for(int k=0; k<nk; ++k) for(int j=0; j<nj; ++j){
      int total_count=0;
      for(int i=0; i<ni; ++i){
         total_count+=intersection_count(i,j,k);
         if(total_count%2==1){ // if parity of intersections so far is odd,
            phi(i,j,k)=-phi(i,j,k); // we are inside the mesh
         }
      }
   }
}